

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O0

void printOperand(MCInst *MI,uint OpNo,SStream *O)

{
  byte bVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  uint uVar4;
  MCOperand *op;
  uint8_t *puVar5;
  uint local_4c;
  ulong local_38;
  int64_t imm;
  uint reg;
  MCOperand *Op;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNo);
  _Var3 = MCOperand_isReg(op);
  if (_Var3) {
    uVar4 = MCOperand_getReg(op);
    printRegName(O,uVar4);
    if (MI->csh->detail != CS_OPT_OFF) {
      if ((MI->csh->doing_mem & 1U) == 0) {
        puVar5 = MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x3e;
        puVar5[0] = '\x01';
        puVar5[1] = '\0';
        puVar5[2] = '\0';
        puVar5[3] = '\0';
        *(uint *)(MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x46) = uVar4;
        MI->flat_insn->detail->groups
        [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5e] =
             MI->csh->regsize_map[uVar4];
        pcVar2 = MI->flat_insn->detail;
        (pcVar2->field_6).x86.op_count = (pcVar2->field_6).x86.op_count + '\x01';
      }
      else {
        *(uint *)(MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x4a) = uVar4;
      }
    }
    if (MI->op1_size != '\0') {
      return;
    }
    MI->op1_size = MI->csh->regsize_map[uVar4];
    return;
  }
  _Var3 = MCOperand_isImm(op);
  if (!_Var3) {
    return;
  }
  local_38 = MCOperand_getImm(op);
  uVar4 = MI->flat_insn->id;
  if (uVar4 != 0x19) {
    if (uVar4 == 0x95) {
      if (((long)local_38 < 0) || (9 < (long)local_38)) {
        local_38 = local_38 & 0xffff;
        SStream_concat(O,"0x%x",local_38);
      }
      else {
        SStream_concat(O,"%u",local_38);
      }
      goto LAB_00206653;
    }
    if ((uVar4 != 0x145) && (uVar4 != 0x147)) {
      if ((long)local_38 < 0) {
        if ((long)local_38 < -9) {
          SStream_concat(O,"-0x%lx",-local_38);
        }
        else {
          SStream_concat(O,"-%lu",-local_38);
        }
      }
      else if ((long)local_38 < 10) {
        SStream_concat(O,"%lu",local_38);
      }
      else {
        SStream_concat(O,"0x%lx",local_38);
      }
      goto LAB_00206653;
    }
  }
  if (((long)local_38 < 0) || (9 < (long)local_38)) {
    if (MI->op1_size == '\0') {
      bVar1 = MI->imm_size;
    }
    else {
      bVar1 = MI->op1_size;
    }
    local_4c = (uint)bVar1;
    SStream_concat(O,"0x%lx",arch_masks[(int)local_4c] & local_38);
  }
  else {
    SStream_concat(O,"%u",local_38);
  }
LAB_00206653:
  if (MI->csh->detail != CS_OPT_OFF) {
    if ((MI->csh->doing_mem & 1U) == 0) {
      puVar5 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x3e;
      puVar5[0] = '\x02';
      puVar5[1] = '\0';
      puVar5[2] = '\0';
      puVar5[3] = '\0';
      if ((MI->flat_insn->detail->field_6).x86.op_count == '\0') {
        MI->flat_insn->detail->groups
        [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5e] = MI->imm_size;
      }
      else {
        MI->flat_insn->detail->groups
        [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5e] =
             *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50);
      }
      *(ulong *)(MI->flat_insn->detail->groups +
                (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x46) = local_38;
      pcVar2 = MI->flat_insn->detail;
      (pcVar2->field_6).x86.op_count = (pcVar2->field_6).x86.op_count + '\x01';
    }
    else {
      *(ulong *)(MI->flat_insn->detail->groups +
                (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x56) = local_38;
    }
  }
  return;
}

Assistant:

static void printOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op  = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isReg(Op)) {
		unsigned int reg = MCOperand_getReg(Op);

		printRegName(O, reg);
		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = reg;
			} else {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].reg = reg;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.op_count++;
			}
		}

		if (MI->op1_size == 0)
			MI->op1_size = MI->csh->regsize_map[reg];
	} else if (MCOperand_isImm(Op)) {
		int64_t imm = MCOperand_getImm(Op);

		switch(MI->flat_insn->id) {
			default:
				if (imm >= 0) {
					if (imm > HEX_THRESHOLD)
						SStream_concat(O, "0x%"PRIx64, imm);
					else
						SStream_concat(O, "%"PRIu64, imm);
				} else {
					if (imm < -HEX_THRESHOLD)
						SStream_concat(O, "-0x%"PRIx64, -imm);
					else
						SStream_concat(O, "-%"PRIu64, -imm);
				}

				break;

			case X86_INS_AND:
			case X86_INS_OR:
			case X86_INS_XOR:
				// do not print number in negative form
				if (imm >= 0 && imm <= HEX_THRESHOLD)
					SStream_concat(O, "%u", imm);
				else
					SStream_concat(O, "0x%"PRIx64, arch_masks[MI->op1_size? MI->op1_size : MI->imm_size] & imm);
				break;
			case X86_INS_RET:
				// RET imm16
				if (imm >= 0 && imm <= HEX_THRESHOLD)
					SStream_concat(O, "%u", imm);
				else {
					imm = 0xffff & imm;
					SStream_concat(O, "0x%x", 0xffff & imm);
				}
				break;
		}

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = imm;
			} else {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
				if (MI->flat_insn->detail->x86.op_count > 0)
					MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->flat_insn->detail->x86.operands[0].size;
				else
					MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->imm_size;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = imm;
				MI->flat_insn->detail->x86.op_count++;
			}
		}

		//if (MI->op1_size == 0)
		//	MI->op1_size = MI->imm_size;
	}
}